

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  byte bVar1;
  String *pSVar2;
  Vector<kj::String> *pVVar3;
  char *c;
  void *pvVar4;
  RemoveConst<kj::String> **ppRVar5;
  ArrayDisposer **ppAVar6;
  long lVar7;
  String *pSVar8;
  ArrayDisposer **ppAVar9;
  RemoveConst<kj::String> **extraout_RDX;
  char (*params) [3];
  char *__file;
  size_t newSize;
  ArrayDisposer *pAVar11;
  size_t sVar12;
  ArrayDisposer **ppAVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  Fault f_1;
  Fault f;
  String ownPath;
  StringPtr local_88;
  RemoveConst<kj::String> **local_78;
  Vector<kj::String> *local_70;
  String local_68;
  Fault local_50;
  RemoveConst<kj::String> **local_48;
  size_t sStack_40;
  Vector<kj::String> *local_38;
  undefined7 uVar10;
  
  ppAVar13 = (ArrayDisposer **)path.content.ptr;
  local_48 = (RemoveConst<kj::String> **)0x0;
  sStack_40 = 0;
  local_38 = (Vector<kj::String> *)0x0;
  ppAVar9 = ppAVar13;
  local_88.content.ptr = (char *)parts;
  local_88.content.size_ = (size_t)ppAVar13;
  if ((int)path.content.size_ != 0) {
    ppRVar5 = (RemoveConst<kj::String> **)parts;
    if (ppAVar13 < (Vector<kj::String> *)0x5) goto LAB_00340ff0;
    local_78 = (RemoveConst<kj::String> **)0x0;
    if (*(int *)&(parts->builder).ptr == 0x5c3f5c5c) {
      local_88.content.ptr = (char *)((long)&(parts->builder).ptr + 4);
      ppAVar9 = (ArrayDisposer **)
                ((long)&(((Vector<kj::String> *)(ppAVar13 + -4))->builder).disposer + 4);
      local_88.content.size_ = (size_t)ppAVar9;
      if (((undefined1 *)0x4 < ppAVar9) && (*(int *)local_88.content.ptr == 0x5c434e55)) {
        local_88.content.ptr = (char *)&(parts->builder).pos;
        local_88.content.size_ =
             (size_t)&(((Vector<kj::String> *)(ppAVar13 + -4))->builder).disposer;
      }
      ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
      local_70 = (Vector<kj::String> *)0x0;
      sVar12 = 0;
      local_78 = (RemoveConst<kj::String> **)0x0;
      goto LAB_00341242;
    }
    sVar12 = 0;
    local_70 = (Vector<kj::String> *)0x0;
    ppAVar6 = ppAVar13;
LAB_0034103f:
    if (*(short *)parts != 0x5c5c) {
LAB_0034104e:
      ppAVar13 = ppAVar6;
      if (*(byte *)parts == 0x5c) {
        if ((char)path.content.size_ != '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    ((Fault *)&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x177,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal((Fault *)&local_68);
        }
        ppAVar9 = (ArrayDisposer **)(this->parts).ptr;
        lVar7 = (this->parts).size_ - (long)ppAVar9;
        if (lVar7 == 0) {
LAB_0034110f:
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                    (&local_50,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x182,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                     (char (*) [26])"must specify drive letter",&local_88);
          ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
          str<char_const(&)[3]>(&local_68,(kj *)"c:",params);
          pSVar8 = (String *)(this->parts).size_;
          if (pSVar8 == (String *)(this->parts).disposer) {
            pSVar2 = (this->parts).ptr;
            newSize = 4;
            if (pSVar8 != pSVar2) {
              newSize = ((long)pSVar8 - (long)pSVar2 >> 3) * 0x5555555555555556;
            }
            Vector<kj::String>::setCapacity((Vector<kj::String> *)this,newSize);
            pSVar8 = (String *)(this->parts).size_;
          }
          (pSVar8->content).ptr = local_68.content.ptr;
          (pSVar8->content).size_ = local_68.content.size_;
          (pSVar8->content).disposer = local_68.content.disposer;
          (this->parts).size_ = (size_t)(pSVar8 + 1);
          _::Debug::Fault::~Fault(&local_50);
          ppAVar9 = (ArrayDisposer **)local_68.content.disposer;
        }
        else {
          if (((((Vector<kj::String> *)ppAVar9)->builder).pos == (RemoveConst<kj::String> *)0x3) &&
             (ppAVar9 = (ArrayDisposer **)(((Vector<kj::String> *)ppAVar9)->builder).ptr,
             *(byte *)((long)&(((Vector<kj::String> *)ppAVar9)->builder).ptr + 1) == 0x3a)) {
            bVar1 = *(byte *)&(((Vector<kj::String> *)ppAVar9)->builder).ptr;
            uVar10 = (undefined7)((ulong)ppAVar9 >> 8);
            ppAVar9 = (ArrayDisposer **)CONCAT71(uVar10,bVar1);
            if ((char)bVar1 < 'a') {
              ppAVar9 = (ArrayDisposer **)CONCAT71(uVar10,bVar1 + 0xbf);
              if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_0034109b;
            }
            else if (0x7a < bVar1) goto LAB_0034109b;
            __file = (char *)0x1;
          }
          else {
LAB_0034109b:
            if ((ulong)((lVar7 >> 3) * -0x5555555555555555) < 2) goto LAB_0034110f;
            __file = (char *)0x2;
          }
          ArrayBuilder<kj::String>::truncate
                    ((ArrayBuilder<kj::String> *)this,__file,(__off_t)ppRVar5);
        }
        goto LAB_00341242;
      }
      goto LAB_003410b6;
    }
    local_88.content.ptr = (char *)((long)parts + 2);
    local_88.content.size_ = (long)&(((Vector<kj::String> *)(ppAVar6 + -4))->builder).disposer + 6;
    goto LAB_00341102;
  }
  puVar15 = (undefined1 *)((long)&(((Vector<kj::String> *)(ppAVar13 + -4))->builder).disposer + 7);
  pvVar4 = memchr(parts,0x2f,(size_t)puVar15);
  ppRVar5 = extraout_RDX;
  if (pvVar4 == (void *)0x0) {
LAB_00340ff0:
    local_70 = (Vector<kj::String> *)0x0;
    local_78 = (RemoveConst<kj::String> **)0x0;
    sVar12 = 0;
  }
  else {
    heapString(&local_68,(char *)parts,(size_t)puVar15);
    local_48 = (RemoveConst<kj::String> **)local_68.content.ptr;
    sStack_40 = local_68.content.size_;
    local_70 = (Vector<kj::String> *)local_68.content.disposer;
    local_38 = (Vector<kj::String> *)local_68.content.disposer;
    ppRVar5 = (RemoveConst<kj::String> **)local_68.content.ptr;
    if (local_68.content.size_ == 0) {
      ppRVar5 = (RemoveConst<kj::String> **)0x0;
    }
    local_78 = (RemoveConst<kj::String> **)local_68.content.ptr;
    ppAVar9 = (ArrayDisposer **)((byte *)((long)local_68.content.ptr + -1) + local_68.content.size_)
    ;
    if (local_68.content.size_ == 0) {
      ppAVar9 = (ArrayDisposer **)0x0;
    }
    for (; ppRVar5 != (RemoveConst<kj::String> **)ppAVar9;
        ppRVar5 = (RemoveConst<kj::String> **)((long)ppRVar5 + 1)) {
      if (*(byte *)ppRVar5 == 0x2f) {
        *(byte *)ppRVar5 = 0x5c;
      }
    }
    parts = (Vector<kj::String> *)(RemoveConst<kj::String> **)0x36d124;
    if (local_68.content.size_ != 0) {
      parts = (Vector<kj::String> *)local_68.content.ptr;
    }
    ppAVar13 = (ArrayDisposer **)(local_68.content.size_ + (local_68.content.size_ == 0));
    ppRVar5 = (RemoveConst<kj::String> **)local_68.content.ptr;
    sVar12 = local_68.content.size_;
    local_88.content.ptr = (char *)parts;
    local_88.content.size_ = (size_t)ppAVar13;
  }
  ppAVar6 = ppAVar13;
  if ((ArrayDisposer **)0x2 < ppAVar13) goto LAB_0034103f;
  ppAVar6 = (ArrayDisposer **)0x2;
  if (ppAVar13 == (ArrayDisposer **)0x2) goto LAB_0034104e;
LAB_003410b6:
  puVar15 = (undefined1 *)((long)&(((Vector<kj::String> *)(ppAVar13 + -4))->builder).disposer + 7);
  if (((puVar15 == (undefined1 *)0x2) ||
      (((undefined1 *)0x2 < puVar15 && (*(byte *)((long)parts + 2) == 0x5c)))) &&
     (*(byte *)((long)parts + 1) == 0x3a)) {
    bVar1 = *(byte *)parts;
    if ((char)bVar1 < 'a') {
      if ((byte)(bVar1 + 0xbf) < 0x1a) goto LAB_00341102;
    }
    else if (bVar1 < 0x7b) {
LAB_00341102:
      ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
      goto LAB_00341242;
    }
  }
  if ((char)path.content.size_ != '\0') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x18e,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
               (char (*) [39])"parseWin32Api() requires absolute path");
    _::Debug::Fault::fatal((Fault *)&local_68);
  }
LAB_00341242:
  puVar15 = (undefined1 *)0x0;
  pVVar3 = (Vector<kj::String> *)(local_88.content.size_ + -0x20);
  if ((ArrayDisposer **)local_88.content.size_ == (ArrayDisposer **)0x1) {
    ppAVar13 = (ArrayDisposer **)0x1;
  }
  else {
    puVar14 = (undefined1 *)0x0;
    do {
      if (puVar14[(long)local_88.content.ptr] == '\\') {
        part.size_ = (size_t)ppAVar9;
        part.ptr = puVar14 + -(long)puVar15;
        evalPart(this,(Vector<kj::String> *)(puVar15 + (long)local_88.content.ptr),part);
        puVar15 = puVar14 + 1;
      }
      puVar14 = puVar14 + 1;
      ppAVar13 = (ArrayDisposer **)local_88.content.size_;
    } while (puVar14 != (undefined1 *)((long)&(pVVar3->builder).disposer + 7));
  }
  part_00.ptr = (byte *)((long)ppAVar13 + ~(ulong)puVar15);
  part_00.size_ = (size_t)ppAVar9;
  evalPart(this,(Vector<kj::String> *)(puVar15 + (long)local_88.content.ptr),part_00);
  pAVar11 = (ArrayDisposer *)(this->parts).size_;
  if (pAVar11 != (this->parts).disposer) {
    Vector<kj::String>::setCapacity
              ((Vector<kj::String> *)this,
               ((long)pAVar11 - (long)(this->parts).ptr >> 3) * -0x5555555555555555);
    pAVar11 = (ArrayDisposer *)(this->parts).size_;
  }
  pSVar8 = (this->parts).ptr;
  pSVar2 = this[1].parts.ptr;
  (this->parts).ptr = (String *)0x0;
  (this->parts).size_ = 0;
  (this->parts).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar8;
  (__return_storage_ptr__->parts).size_ = ((long)pAVar11 - (long)pSVar8 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)pSVar2;
  if (local_78 != (RemoveConst<kj::String> **)0x0) {
    local_48 = (RemoveConst<kj::String> **)0x0;
    sStack_40 = 0;
    (*(code *)(((local_70->builder).ptr)->content).ptr)(local_70,local_78,1,sVar12,sVar12,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != nullptr) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.slice(0, 2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}